

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O2

void __thiscall TPZSkylMatrix<double>::ReallocForNuma(TPZSkylMatrix<double> *this)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  double **ppdVar4;
  int i;
  long lVar5;
  
  TPZVec<double_*>::ReallocForNuma(&this->fElem);
  pdVar1 = (this->fStorage).fStore;
  TPZVec<double>::ReallocForNuma(&this->fStorage);
  lVar2 = (this->fElem).fNElements;
  pdVar3 = (this->fStorage).fStore;
  for (lVar5 = 0; lVar5 < lVar2; lVar5 = lVar5 + 1) {
    ppdVar4 = (this->fElem).fStore;
    ppdVar4[lVar5] = (double *)(((long)ppdVar4[lVar5] - (long)pdVar1) + (long)pdVar3);
  }
  return;
}

Assistant:

void ReallocForNuma() {
        fElem.ReallocForNuma();
        TVar* old_start = &fStorage[0];
        fStorage.ReallocForNuma();
        TVar* new_start = &fStorage[0];
        for (int i=0; i<fElem.size(); i++) {
            fElem[i] = new_start + (fElem[i]-old_start);
        }
	}